

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::ConvertToOutputFormat
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,OutputFormat output
          )

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar2;
  cmState *pcVar3;
  char *path;
  char local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  if (output == MAKERULE) {
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_38,(cmSystemTools *)(__return_storage_ptr__->_M_dataplus)._M_p,path);
  }
  else if ((output & ~MAKERULE) == SHELL) {
    pcVar3 = cmState::Snapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseMSYSShell(pcVar3);
    if ((((bVar2) && (this->LinkScriptShell == false)) &&
        (2 < __return_storage_ptr__->_M_string_length)) &&
       (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar1[1] == ':')) {
      pcVar1[1] = *pcVar1;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '/';
    }
    pcVar3 = cmState::Snapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWindowsShell(pcVar3);
    if (bVar2) {
      __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_38._M_dataplus._M_p._0_1_ = 0x2f;
      local_39 = '\\';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__first._M_current + __return_storage_ptr__->_M_string_length),
                 (char *)&local_38,&local_39);
    }
    EscapeForShell(&local_38,this,__return_storage_ptr__,true,false,output == WATCOMQUOTE);
  }
  else {
    if (output != RESPONSE) {
      return __return_storage_ptr__;
    }
    EscapeForShell(&local_38,this,__return_storage_ptr__,false,false,false);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(const std::string& source,
                                                     OutputFormat output) const
{
  std::string result = source;
  // Convert it to an output path.
  if (output == MAKERULE)
    {
    result = cmSystemTools::ConvertToOutputPath(result.c_str());
    }
  else if(output == SHELL || output == WATCOMQUOTE)
    {
        // For the MSYS shell convert drive letters to posix paths, so
    // that c:/some/path becomes /c/some/path.  This is needed to
    // avoid problems with the shell path translation.
    if(this->GetState()->UseMSYSShell() && !this->LinkScriptShell)
      {
      if(result.size() > 2 && result[1] == ':')
        {
        result[1] = result[0];
        result[0] = '/';
        }
      }
    if(this->GetState()->UseWindowsShell())
      {
      std::replace(result.begin(), result.end(), '/', '\\');
      }
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE);
    }
  else if(output == RESPONSE)
    {
    result = this->EscapeForShell(result, false, false, false);
    }
  return result;
}